

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::emplace<VkSpecParser::TypedName>
          (QGenericArrayOps<VkSpecParser::TypedName> *this,qsizetype i,TypedName *args)

{
  TypedName **ppTVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_c8;
  TypedName tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<VkSpecParser::TypedName>).size == i) {
      qVar5 = QArrayDataPointer<VkSpecParser::TypedName>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<VkSpecParser::TypedName>);
      if (qVar5 == 0) goto LAB_00108847;
      VkSpecParser::TypedName::TypedName
                ((this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr +
                 (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size,args);
LAB_0010896a:
      pqVar2 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00108923;
    }
LAB_00108847:
    if (i == 0) {
      qVar5 = QArrayDataPointer<VkSpecParser::TypedName>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<VkSpecParser::TypedName>);
      if (qVar5 != 0) {
        VkSpecParser::TypedName::TypedName
                  ((this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr + -1,args);
        ppTVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
        *ppTVar1 = *ppTVar1 + -1;
        goto LAB_0010896a;
      }
    }
  }
  tmp.typeSuffix.d.size = -0x5555555555555556;
  tmp.typeSuffix.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.typeSuffix.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.type.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.type.d.size = -0x5555555555555556;
  tmp.name.d.size = -0x5555555555555556;
  tmp.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  VkSpecParser::TypedName::TypedName(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size != 0;
  QArrayDataPointer<VkSpecParser::TypedName>::detachAndGrow
            (&this->super_QArrayDataPointer<VkSpecParser::TypedName>,(uint)(i == 0 && bVar6),1,
             (TypedName **)0x0,(QArrayDataPointer<VkSpecParser::TypedName> *)0x0);
  if (i == 0 && bVar6) {
    VkSpecParser::TypedName::TypedName
              ((this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr + -1,&tmp);
    ppTVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
    *ppTVar1 = *ppTVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_c8.sourceCopyConstruct = 0;
    local_c8.nSource = 0;
    local_c8.move = 0;
    local_c8.sourceCopyAssign = 0;
    local_c8.end = (TypedName *)0x0;
    local_c8.last = (TypedName *)0x0;
    local_c8.where = (TypedName *)0x0;
    local_c8.begin = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
    local_c8.size = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
    local_c8.data = &this->super_QArrayDataPointer<VkSpecParser::TypedName>;
    Inserter::insertOne(&local_c8,i,&tmp);
    (local_c8.data)->ptr = local_c8.begin;
    (local_c8.data)->size = local_c8.size;
  }
  VkSpecParser::TypedName::~TypedName(&tmp);
LAB_00108923:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }